

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand.c
# Opt level: O2

unsigned_long bit_offset(dmr_C *C,expression *expr)

{
  unsigned_long offset;
  unsigned_long uVar1;
  
  uVar1 = 0;
  for (; *(char *)expr == '\x1b'; expr = (expr->field_5).field_6.right) {
    uVar1 = uVar1 + (long)C->target->bits_in_char * (long)(expr->field_5).field_2.wide;
  }
  if (expr->ctype != (symbol *)0x0) {
    uVar1 = uVar1 + *(byte *)((long)&expr->ctype->field_14 + 0xc);
  }
  return uVar1;
}

Assistant:

static unsigned long bit_offset(struct dmr_C *C, const struct expression *expr)
{
	unsigned long offset = 0;
	while (expr->type == EXPR_POS) {
		offset += dmrC_bytes_to_bits(C->target, expr->init_offset);
		expr = expr->init_expr;
	}
	if (expr && expr->ctype)
		offset += expr->ctype->bit_offset;
	return offset;
}